

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsSealed
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance)

{
  IndexPropertyDescriptorMap *this_00;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  bool bVar2;
  BOOL BVar3;
  IndexPropertyDescriptor *pIVar4;
  ES5Array *arr;
  byte bVar5;
  int i;
  int i_00;
  
  BVar3 = DictionaryTypeHandlerBase<int>::IsSealed
                    (&this->super_DictionaryTypeHandlerBase<int>,instance);
  if (BVar3 == 0) {
LAB_00c411a8:
    BVar3 = 0;
  }
  else {
    for (i_00 = 0; this_00 = (this->indexPropertyMap).ptr, pBVar1 = (this_00->indexPropertyMap).ptr,
        i_00 < pBVar1->count - pBVar1->freeCount; i_00 = i_00 + 1) {
      pIVar4 = IndexPropertyDescriptorMap::GetReferenceAt(this_00,i_00);
      bVar5 = pIVar4->Attributes >> 1;
      if ((pIVar4->Attributes & 8) != 0) {
        bVar5 = 0;
      }
      if ((bVar5 & 1) != 0) goto LAB_00c411a8;
    }
    if ((this->dataItemAttributes & 2) != 0) {
      arr = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
      bVar2 = HasAnyDataItemNotInMap(this,arr);
      if (bVar2) goto LAB_00c411a8;
    }
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsSealed(DynamicObject* instance)
    {
        if (!__super::IsSealed(instance))
        {
            return false;
        }

        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            IndexPropertyDescriptor* descriptor = indexPropertyMap->GetReferenceAt(i);
            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip deleted
            }
            if (descriptor->Attributes & PropertyConfigurable)
            {
                //[[Configurable]] must be false for all properties.
                return false;
            }
        }

        // Check data item not in map
        if (this->GetDataItemAttributes() & PropertyConfigurable)
        {
            if (HasAnyDataItemNotInMap(VarTo<ES5Array>(instance)))
            {
                return false;
            }
        }

        return true;
    }